

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O3

cs_err cs_close(csh *handle)

{
  void *__s;
  void *pvVar1;
  void *pvVar2;
  cs_err cVar3;
  
  __s = (void *)*handle;
  if (__s == (void *)0x0) {
    cVar3 = CS_ERR_CSH;
  }
  else {
    if (*(void **)((long)__s + 0x10) != (void *)0x0) {
      (*cs_mem_free)(*(void **)((long)__s + 0x10));
    }
    pvVar2 = *(void **)((long)__s + 0xb0);
    while (pvVar2 != (void *)0x0) {
      pvVar1 = *(void **)((long)pvVar2 + 0x28);
      (*cs_mem_free)(pvVar2);
      pvVar2 = pvVar1;
    }
    (*cs_mem_free)(*(void **)((long)__s + 0x70));
    cVar3 = CS_ERR_OK;
    memset(__s,0,0xb8);
    (*cs_mem_free)(__s);
    *handle = 0;
  }
  return cVar3;
}

Assistant:

CAPSTONE_API cs_close(csh *handle)
{
	struct cs_struct *ud;
	struct insn_mnem *next, *tmp;

	if (*handle == 0)
		// invalid handle
		return CS_ERR_CSH;

	ud = (struct cs_struct *)(*handle);

	if (ud->printer_info)
		cs_mem_free(ud->printer_info);

	// free the linked list of customized mnemonic
	tmp = ud->mnem_list;
	while(tmp) {
		next = tmp->next;
		cs_mem_free(tmp);
		tmp = next;
	}

	cs_mem_free(ud->insn_cache);

	memset(ud, 0, sizeof(*ud));
	cs_mem_free(ud);

	// invalidate this handle by ZERO out its value.
	// this is to make sure it is unusable after cs_close()
	*handle = 0;

	return CS_ERR_OK;
}